

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::anon_unknown_5::UnknownFieldOrdering::operator()
          (UnknownFieldOrdering *this,IndexUnknownFieldPair *a,IndexUnknownFieldPair *b)

{
  int iVar1;
  uint32 uVar2;
  bool bVar3;
  
  iVar1 = **(int **)(this + 8);
  uVar2 = a->second->number_;
  bVar3 = true;
  if ((int)uVar2 <= iVar1) {
    if ((int)uVar2 < iVar1) {
      bVar3 = false;
    }
    else {
      bVar3 = (*(int **)(this + 8))[1] < (int)a->second->type_;
    }
  }
  return bVar3;
}

Assistant:

inline bool operator()(const IndexUnknownFieldPair& a,
                         const IndexUnknownFieldPair& b) const {
    if (a.second->number() < b.second->number()) return true;
    if (a.second->number() > b.second->number()) return false;
    return a.second->type() < b.second->type();
  }